

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

Vec_Wec_t * Gia_ManLevelizeR(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *p_00;
  bool bVar3;
  int local_2c;
  int i;
  int Level;
  int nLevels;
  Vec_Wec_t *vLevels;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManLevelRNum(p);
  p_00 = Vec_WecStart(iVar1 + 1);
  local_2c = 0;
  while( true ) {
    bVar3 = false;
    if (local_2c < p->nObjs) {
      vLevels = (Vec_Wec_t *)Gia_ManObj(p,local_2c);
      bVar3 = vLevels != (Vec_Wec_t *)0x0;
    }
    if (!bVar3) break;
    if ((local_2c != 0) &&
       ((iVar2 = Gia_ObjIsCo((Gia_Obj_t *)vLevels), iVar2 != 0 ||
        (iVar2 = Gia_ObjLevel(p,(Gia_Obj_t *)vLevels), iVar2 != 0)))) {
      iVar2 = Gia_ObjLevel(p,(Gia_Obj_t *)vLevels);
      if (iVar1 < iVar2) {
        __assert_fail("Level <= nLevels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                      ,0x1ba,"Vec_Wec_t *Gia_ManLevelizeR(Gia_Man_t *)");
      }
      Vec_WecPush(p_00,iVar2,local_2c);
    }
    local_2c = local_2c + 1;
  }
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_ManLevelizeR( Gia_Man_t * p )
{ 
    Gia_Obj_t * pObj;
    Vec_Wec_t * vLevels;
    int nLevels, Level, i;
    nLevels = Gia_ManLevelRNum( p );
    vLevels = Vec_WecStart( nLevels + 1 );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( i == 0 || (!Gia_ObjIsCo(pObj) && !Gia_ObjLevel(p, pObj)) )
            continue;
        Level = Gia_ObjLevel( p, pObj );
        assert( Level <= nLevels );
        Vec_WecPush( vLevels, Level, i );
    }
    return vLevels;
}